

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_shl_cc_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t i)

{
  uint uVar1;
  
  uVar1 = i & 0xff;
  if (0x1f < uVar1) {
    if (uVar1 == 0x20) {
      env->CF = x & 1;
    }
    else {
      env->CF = 0;
    }
    return 0;
  }
  if (uVar1 != 0) {
    env->CF = (uint)((x >> ((byte)(0x20 - (byte)i) & 0x1f) & 1) != 0);
    x = x << ((byte)i & 0x1f);
  }
  return x;
}

Assistant:

uint32_t HELPER(shl_cc)(CPUARMState *env, uint32_t x, uint32_t i)
{
    int shift = i & 0xff;
    if (shift >= 32) {
        if (shift == 32)
            env->CF = x & 1;
        else
            env->CF = 0;
        return 0;
    } else if (shift != 0) {
        env->CF = (x >> (32 - shift)) & 1;
        return x << shift;
    }
    return x;
}